

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

void __thiscall Pathie::ErrnoError::ErrnoError(ErrnoError *this,int val)

{
  string local_230 [32];
  string local_210 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [380];
  int local_14;
  ErrnoError *pEStack_10;
  int val_local;
  ErrnoError *this_local;
  
  local_14 = val;
  pEStack_10 = this;
  PathieError::PathieError(&this->super_PathieError);
  *(undefined ***)&this->super_PathieError = &PTR__ErrnoError_0011dbe8;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(local_190,local_14);
  this->m_val = local_14;
  std::__cxx11::stringstream::str();
  std::operator+((char *)local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Errno ");
  std::operator+(local_1f0,(char *)local_210);
  strerror(local_14);
  std::operator+(local_1d0,(char *)local_1f0);
  std::__cxx11::string::operator=
            ((string *)&(this->super_PathieError).m_pathie_errmsg,(string *)local_1d0);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

ErrnoError::ErrnoError(int val)
{
  std::stringstream ss;
  ss << val;

  m_val = val;
  m_pathie_errmsg = "Errno " + ss.str() + ": " + strerror(val);
}